

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O0

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::OnCatchAllExpr(BinaryReaderInterp *this)

{
  bool bVar1;
  Offset OVar2;
  Label *pLVar3;
  reference pvVar4;
  size_type sVar5;
  Offset offset;
  HandlerDesc *desc;
  Label *label;
  Location local_40;
  Enum local_1c;
  BinaryReaderInterp *local_18;
  BinaryReaderInterp *this_local;
  
  local_18 = this;
  GetLocation(&local_40,this);
  Var::Var((Var *)&label);
  local_1c = (Enum)SharedValidator::OnCatch(&this->validator_,&local_40,(Var *)&label,true);
  bVar1 = Failed((Result)local_1c);
  Var::~Var((Var *)&label);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    pLVar3 = TopLabel(this);
    pvVar4 = std::vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>::
             operator[](&this->func_->handlers,(ulong)pLVar3->handler_desc_index);
    pvVar4->kind = Catch;
    if (pLVar3->kind == Block) {
      Istream::EmitCatchDrop(this->istream_,1);
    }
    OVar2 = pLVar3->offset;
    Istream::Emit(this->istream_,Br);
    if (OVar2 != 0xffffffff) {
      __assert_fail("offset == Istream::kInvalidOffset",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/interp/binary-reader-interp.cc"
                    ,0x6a6,
                    "virtual Result wabt::interp::(anonymous namespace)::BinaryReaderInterp::OnCatchAllExpr()"
                   );
    }
    sVar5 = std::
            vector<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
            ::size(&this->label_stack_);
    OVar2 = Istream::end(this->istream_);
    FixupMap::Append(&this->depth_fixups_,(int)sVar5 - 1,OVar2);
    Istream::Emit(this->istream_,0xffffffff);
    if (pvVar4->try_end_offset == 0xffffffff) {
      OVar2 = Istream::end(this->istream_);
      pvVar4->try_end_offset = OVar2;
    }
    pLVar3->kind = Block;
    OVar2 = Istream::end(this->istream_);
    (pvVar4->field_4).catch_all_offset = OVar2;
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderInterp::OnCatchAllExpr() {
  CHECK_RESULT(validator_.OnCatch(GetLocation(), Var(), true));
  Label* label = TopLabel();
  HandlerDesc& desc = func_->handlers[label->handler_desc_index];
  desc.kind = HandlerKind::Catch;
  if (label->kind == LabelKind::Block) {
    istream_.EmitCatchDrop(1);
  }
  Istream::Offset offset = label->offset;
  istream_.Emit(Opcode::Br);
  assert(offset == Istream::kInvalidOffset);
  depth_fixups_.Append(label_stack_.size() - 1, istream_.end());
  istream_.Emit(offset);
  if (desc.try_end_offset == Istream::kInvalidOffset) {
    desc.try_end_offset = istream_.end();
  }
  label->kind = LabelKind::Block;
  desc.catch_all_offset = istream_.end();
  return Result::Ok;
}